

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkInitialState(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *p0;
  ulong uVar2;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x10a,"Abc_Ntk_t *Abc_NtkInitialState(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->vPis->nSize;
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  p0 = Abc_AigConst1(pNtk_00);
  if (1 < iVar1) {
    uVar2 = 0;
    do {
      if ((long)pNtk_00->vPis->nSize <= (long)uVar2) goto LAB_00285972;
      p0 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,p0,
                      (Abc_Obj_t *)((ulong)pNtk_00->vPis->pArray[uVar2] ^ 1));
      uVar2 = uVar2 + 1;
    } while ((uint)(iVar1 / 2) != uVar2);
  }
  if (0 < pNtk_00->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pNtk_00->vPos->pArray,p0);
    return pNtk_00;
  }
LAB_00285972:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkInitialState( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // compute the all-zero state in terms of the CS variables
    pMiter = Abc_AigConst1(pNtkNew);
    for ( i = 0; i < nVars; i++ )
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pMiter, Abc_ObjNot( Abc_NtkPi(pNtkNew, i) ) );
    // add the PO
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}